

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrB
          (X3DImporter *this,int pAttrIdx,vector<bool,_std::allocator<bool>_> *pValue)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  size_t sVar5;
  back_insert_iterator<std::vector<bool,_std::allocator<bool>_>_> bVar6;
  WordIterator local_98;
  WordIterator local_88;
  undefined1 local_78 [8];
  WordIterator wordItEnd;
  WordIterator wordItBegin;
  char *val;
  shared_ptr<const_Assimp::FIValue> local_40;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIBoolValue> boolValue;
  vector<bool,_std::allocator<bool>_> *pValue_local;
  int pAttrIdx_local;
  X3DImporter *this_local;
  char *__s;
  
  boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pValue;
  pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_40,pFVar3,(ulong)(uint)pAttrIdx);
  std::dynamic_pointer_cast<Assimp::FIBoolValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)local_30);
  std::shared_ptr<const_Assimp::FIValue>::~shared_ptr(&local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi,&peVar4->value);
  }
  else {
    pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar3,(ulong)(uint)pAttrIdx);
    __s = (char *)CONCAT44(extraout_var,iVar2);
    std::vector<bool,_std::allocator<bool>_>::clear
              ((vector<bool,_std::allocator<bool>_> *)
               boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    sVar5 = strlen(__s);
    WordIterator::WordIterator((WordIterator *)&wordItEnd.end_,__s,__s + sVar5);
    WordIterator::WordIterator((WordIterator *)local_78);
    WordIterator::WordIterator(&local_88,(WordIterator *)&wordItEnd.end_);
    WordIterator::WordIterator(&local_98,(WordIterator *)local_78);
    bVar6 = std::back_inserter<std::vector<bool,std::allocator<bool>>>
                      ((vector<bool,_std::allocator<bool>_> *)
                       boolValue.
                       super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    std::
    transform<Assimp::WordIterator,std::back_insert_iterator<std::vector<bool,std::allocator<bool>>>,Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrB(int,std::vector<bool,std::allocator<bool>>&)::__0>
              (&local_88,&local_98,bVar6.container);
  }
  std::shared_ptr<const_Assimp::FIBoolValue>::~shared_ptr
            ((shared_ptr<const_Assimp::FIBoolValue> *)local_30);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrB(const int pAttrIdx, std::vector<bool>& pValue)
{
    auto boolValue = std::dynamic_pointer_cast<const FIBoolValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (boolValue) {
        pValue = boolValue->value;
    }
    else {
        const char *val = mReader->getAttributeValue(pAttrIdx);
        pValue.clear();

        //std::cregex_iterator wordItBegin(val, val + strlen(val), pattern_nws);
        //const std::cregex_iterator wordItEnd;
        //std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const std::cmatch &match) { return std::regex_match(match.str(), pattern_true); });

        WordIterator wordItBegin(val, val + strlen(val));
        WordIterator wordItEnd;
        std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const char *match) { return (::tolower(match[0]) == 't') || (match[0] == '1'); });
    }
}